

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

void __thiscall xe::TestSet::add(TestSet *this,TestNode *node)

{
  Error *this_00;
  TestGroup *local_18;
  
  if (node->m_nodeType < TESTNODETYPE_TEST_CASE) {
    addGroup(this,(TestGroup *)node);
    return;
  }
  local_18 = (TestGroup *)node;
  if (node->m_nodeType != TESTNODETYPE_TEST_CASE) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_00,(char *)0x0,
                 "node->getNodeType() == TESTNODETYPE_GROUP || node->getNodeType() == TESTNODETYPE_ROOT"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                 ,0x17d);
    __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    std::
    _Rb_tree<xe::TestNode_const*,xe::TestNode_const*,std::_Identity<xe::TestNode_const*>,std::less<xe::TestNode_const*>,std::allocator<xe::TestNode_const*>>
    ::_M_insert_unique<xe::TestNode_const*const&>
              ((_Rb_tree<xe::TestNode_const*,xe::TestNode_const*,std::_Identity<xe::TestNode_const*>,std::less<xe::TestNode_const*>,std::allocator<xe::TestNode_const*>>
                *)this,(TestNode **)&local_18);
    local_18 = (local_18->super_TestNode).m_parent;
  } while (local_18 != (TestGroup *)0x0);
  return;
}

Assistant:

void TestSet::add (const TestNode* node)
{
	if (node->getNodeType() == TESTNODETYPE_TEST_CASE)
		addCase(static_cast<const TestCase*>(node));
	else
	{
		XE_CHECK(node->getNodeType() == TESTNODETYPE_GROUP ||
				  node->getNodeType() == TESTNODETYPE_ROOT);
		addGroup(static_cast<const TestGroup*>(node));
	}
}